

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastBrBReturn(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BYTE scale;
  uint32 uVar3;
  DWORD offset;
  undefined4 *puVar4;
  Opnd *pOVar5;
  LabelInstr *target;
  LabelInstr *target_00;
  Opnd *pOVar6;
  IntConstOpnd *pIVar7;
  RegOpnd *pRVar8;
  RegOpnd *pRVar9;
  IndirOpnd *pIVar10;
  RegOpnd *pRVar11;
  BranchInstr *pBVar12;
  LabelInstr *local_180;
  LabelInstr *local_118;
  RegOpnd *objectIndexOpnd;
  RegOpnd *indexesOpnd;
  RegOpnd *stringsOpnd;
  Opnd *opndDst;
  LabelInstr *labelAfter;
  RegOpnd *enumeratedCountOpnd;
  RegOpnd *cachedDataOpnd;
  RegOpnd *cachedDataTypeOpnd;
  RegOpnd *objectOpnd;
  Opnd *canUseJitFastPathOpnd;
  LabelInstr *loopBody;
  LabelInstr *labelHelper;
  Opnd *forInEnumeratorOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  if ((instr->m_opcode != BrOnEmpty) && (instr->m_opcode != BrOnNotEmpty)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x270c,
                       "(instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = IR::Instr::GetSrc1(instr);
  if ((pOVar5 == (Opnd *)0x0) || (pOVar5 = IR::Instr::GetSrc2(instr), pOVar5 != (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x270d,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                       "Expected 1 src opnds on BrB");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar5 = IR::Instr::GetSrc1(instr);
  target = IR::LabelInstr::New(Label,this->m_func,true);
  target_00 = IR::LabelInstr::New(Label,this->m_func,false);
  uVar3 = Js::ForInObjectEnumerator::GetOffsetOfCanUseJitFastPath();
  pOVar6 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyInt8);
  pIVar7 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
  InsertCompareBranch(this,pOVar6,&pIVar7->super_Opnd,BrEq_A,target,instr,false);
  pRVar8 = IR::RegOpnd::New(TyUint64,this->m_func);
  uVar3 = Js::ForInObjectEnumerator::GetOffsetOfEnumeratorObject();
  pOVar6 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyUint64);
  InsertMove(&pRVar8->super_Opnd,pOVar6,instr,true);
  pRVar9 = IR::RegOpnd::New(TyUint64,this->m_func);
  uVar3 = Js::ForInObjectEnumerator::GetOffsetOfEnumeratorInitialType();
  pOVar6 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyUint64);
  InsertMove(&pRVar9->super_Opnd,pOVar6,instr,true);
  offset = Js::DynamicObject::GetOffsetOfType();
  pIVar10 = IR::IndirOpnd::New(pRVar8,offset,TyUint64,this->m_func,false);
  InsertCompareBranch(this,&pRVar9->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,target,instr,false);
  pRVar8 = IR::RegOpnd::New(TyUint64,this->m_func);
  uVar3 = Js::ForInObjectEnumerator::GetOffsetOfEnumeratorCachedData();
  pOVar6 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyUint64);
  InsertMove(&pRVar8->super_Opnd,pOVar6,instr,true);
  pRVar9 = IR::RegOpnd::New(TyUint32,this->m_func);
  uVar3 = Js::ForInObjectEnumerator::GetOffsetOfEnumeratorEnumeratedCount();
  pOVar6 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyUint32);
  InsertMove(&pRVar9->super_Opnd,pOVar6,instr,true);
  uVar3 = Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataCachedCount();
  pIVar10 = IR::IndirOpnd::New(pRVar8,uVar3,TyUint32,this->m_func,false);
  InsertCompareBranch(this,&pRVar9->super_Opnd,&pIVar10->super_Opnd,BrLt_A,target_00,instr,false);
  local_180 = IR::Instr::GetOrCreateContinueLabel(instr,false);
  uVar3 = Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataCompleted();
  pIVar10 = IR::IndirOpnd::New(pRVar8,uVar3,TyInt8,this->m_func,false);
  pIVar7 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
  local_118 = local_180;
  if (instr->m_opcode != BrOnNotEmpty) {
    pBVar12 = IR::Instr::AsBranchInstr(instr);
    local_118 = IR::BranchInstr::GetTarget(pBVar12);
  }
  InsertCompareBranch(this,&pIVar10->super_Opnd,&pIVar7->super_Opnd,BrNeq_A,local_118,instr,false);
  InsertBranch(Br,target,instr);
  IR::Instr::InsertBefore(instr,&target_00->super_Instr);
  pOVar6 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2741,"(opndDst->IsRegOpnd())","opndDst->IsRegOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar11 = IR::RegOpnd::New(TyUint64,this->m_func);
  uVar3 = Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataStrings();
  pIVar10 = IR::IndirOpnd::New(pRVar8,uVar3,TyUint64,this->m_func,false);
  InsertMove(&pRVar11->super_Opnd,&pIVar10->super_Opnd,instr,true);
  scale = LowererMD::GetDefaultIndirScale();
  pIVar10 = IR::IndirOpnd::New(pRVar11,pRVar9,scale,TyVar,this->m_func);
  InsertMove(pOVar6,&pIVar10->super_Opnd,instr,true);
  pRVar11 = IR::RegOpnd::New(TyUint64,this->m_func);
  uVar3 = Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataIndexes();
  pIVar10 = IR::IndirOpnd::New(pRVar8,uVar3,TyUint64,this->m_func,false);
  InsertMove(&pRVar11->super_Opnd,&pIVar10->super_Opnd,instr,true);
  pRVar8 = IR::RegOpnd::New(TyUint32,this->m_func);
  pIVar10 = IR::IndirOpnd::New(pRVar11,pRVar9,'\x02',TyUint32,this->m_func);
  InsertMove(&pRVar8->super_Opnd,&pIVar10->super_Opnd,instr,true);
  uVar3 = Js::ForInObjectEnumerator::GetOffsetOfEnumeratorObjectIndex();
  pOVar6 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyUint32);
  InsertMove(pOVar6,&pRVar8->super_Opnd,instr,true);
  pIVar7 = IR::IntConstOpnd::New(1,TyUint32,this->m_func,false);
  InsertAdd(false,&pRVar9->super_Opnd,&pRVar9->super_Opnd,&pIVar7->super_Opnd,instr);
  uVar3 = Js::ForInObjectEnumerator::GetOffsetOfEnumeratorEnumeratedCount();
  pOVar5 = GetForInEnumeratorFieldOpnd(this,pOVar5,uVar3,TyUint32);
  InsertMove(pOVar5,&pRVar9->super_Opnd,instr,true);
  if (instr->m_opcode == BrOnNotEmpty) {
    pBVar12 = IR::Instr::AsBranchInstr(instr);
    local_180 = IR::BranchInstr::GetTarget(pBVar12);
  }
  InsertBranch(Br,local_180,instr);
  IR::Instr::InsertBefore(instr,&target->super_Instr);
  return;
}

Assistant:

void
Lowerer::GenerateFastBrBReturn(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::BrOnEmpty || instr->m_opcode == Js::OpCode::BrOnNotEmpty);
    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnds on BrB");

    IR::Opnd * forInEnumeratorOpnd = instr->GetSrc1();
    IR::LabelInstr * labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr * loopBody = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    // CMP forInEnumerator->canUseJitFastPath, 0
    // JEQ $helper
    IR::Opnd * canUseJitFastPathOpnd = GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfCanUseJitFastPath(), TyInt8);
    InsertCompareBranch(canUseJitFastPathOpnd, IR::IntConstOpnd::New(0, TyInt8, this->m_func), Js::OpCode::BrEq_A, labelHelper, instr);

    // MOV objectOpnd, forInEnumerator->enumerator.object
    // MOV cachedDataTypeOpnd, forInEnumerator->enumerator.cachedDataType
    // CMP cachedDataTypeOpnd, objectOpnd->type
    // JNE $helper
    IR::RegOpnd * objectOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    InsertMove(objectOpnd,
        GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorObject(), TyMachPtr), instr);
    IR::RegOpnd * cachedDataTypeOpnd = IR::RegOpnd::New(TyMachPtr, this->m_func);
    InsertMove(cachedDataTypeOpnd,
        GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorInitialType(), TyMachPtr), instr);
    InsertCompareBranch(cachedDataTypeOpnd, IR::IndirOpnd::New(objectOpnd, Js::DynamicObject::GetOffsetOfType(), TyMachPtr, this->m_func),
        Js::OpCode::BrNeq_A, labelHelper, instr);

    // MOV cachedDataOpnd, forInEnumeratorOpnd->enumerator.cachedData
    // MOV enumeratedCountOpnd, forInEnumeratorOpnd->enumerator.enumeratedCount
    // CMP enumeratedCountOpnd, cachedDataOpnd->cachedCount
    // JLT $loopBody
    IR::RegOpnd * cachedDataOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(cachedDataOpnd,
        GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorCachedData(), TyMachPtr), instr);
    IR::RegOpnd * enumeratedCountOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(enumeratedCountOpnd,
        GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorEnumeratedCount(), TyUint32), instr);
    InsertCompareBranch(enumeratedCountOpnd,
        IR::IndirOpnd::New(cachedDataOpnd, Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataCachedCount(), TyUint32, this->m_func),
        Js::OpCode::BrLt_A, loopBody, instr);

    // CMP cacheData.completed, 0
    // JNE $loopEnd
    // JMP $helper
    IR::LabelInstr * labelAfter = instr->GetOrCreateContinueLabel();
    InsertCompareBranch(
        IR::IndirOpnd::New(cachedDataOpnd, Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataCompleted(), TyInt8, this->m_func),
        IR::IntConstOpnd::New(0, TyInt8, this->m_func),
        Js::OpCode::BrNeq_A, instr->m_opcode == Js::OpCode::BrOnNotEmpty ? labelAfter : instr->AsBranchInstr()->GetTarget(), instr);
    InsertBranch(Js::OpCode::Br, labelHelper, instr);

    // $loopBody:
    instr->InsertBefore(loopBody);

    IR::Opnd * opndDst = instr->GetDst(); // ForIn result propertyString
    Assert(opndDst->IsRegOpnd());

    // MOV stringsOpnd, cachedData->strings
    // MOV opndDst, stringsOpnd[enumeratedCount]
    IR::RegOpnd * stringsOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(stringsOpnd,
        IR::IndirOpnd::New(cachedDataOpnd, Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataStrings(), TyMachPtr, this->m_func), instr);
    InsertMove(opndDst,
        IR::IndirOpnd::New(stringsOpnd, enumeratedCountOpnd, m_lowererMD.GetDefaultIndirScale(), TyVar, this->m_func), instr);

    // MOV indexesOpnd, cachedData->indexes
    // MOV objectIndexOpnd, indexesOpnd[enumeratedCount]
    // MOV forInEnumeratorOpnd->enumerator.objectIndex, objectIndexOpnd
    IR::RegOpnd * indexesOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(indexesOpnd,
        IR::IndirOpnd::New(cachedDataOpnd, Js::DynamicObjectPropertyEnumerator::GetOffsetOfCachedDataIndexes(), TyMachPtr, this->m_func), instr);
    IR::RegOpnd * objectIndexOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(objectIndexOpnd,
        IR::IndirOpnd::New(indexesOpnd, enumeratedCountOpnd, IndirScale4, TyUint32, this->m_func), instr);
    InsertMove(GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorObjectIndex(), TyUint32),
        objectIndexOpnd, instr);
    // INC enumeratedCountOpnd
    // MOV forInEnumeratorOpnd->enumerator.enumeratedCount, enumeratedCountOpnd
    InsertAdd(false, enumeratedCountOpnd, enumeratedCountOpnd, IR::IntConstOpnd::New(1, TyUint32, this->m_func), instr);
    InsertMove(GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorEnumeratedCount(), TyUint32),
        enumeratedCountOpnd, instr);

    // We know result propertyString (opndDst) != NULL
    InsertBranch(Js::OpCode::Br, instr->m_opcode == Js::OpCode::BrOnNotEmpty ? instr->AsBranchInstr()->GetTarget() : labelAfter, instr);

    // $helper
    instr->InsertBefore(labelHelper);
    // $after
}